

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O1

bool __thiscall irr::gui::CGUIListBox::OnEvent(CGUIListBox *this,SEvent *event)

{
  f32 *pfVar1;
  stringw *this_00;
  byte bVar2;
  EEVENT_TYPE EVar3;
  EKEY_CODE EVar4;
  EGUI_EVENT_TYPE EVar5;
  uint length;
  IGUIScrollBar *pIVar6;
  char cVar7;
  undefined1 uVar8;
  bool bVar9;
  u32 uVar10;
  int iVar11;
  pointer pLVar12;
  uint uVar13;
  s32 ypos;
  long *plVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  SEvent e;
  string<wchar_t> local_88;
  string<wchar_t> local_50;
  
  cVar7 = (**(code **)(*(long *)this + 0x90))();
  if (cVar7 == '\0') goto switchD_00221de5_caseD_1;
  EVar3 = event->EventType;
  if (EVar3 == EET_GUI_EVENT) {
    EVar5 = (event->field_1).GUIEvent.EventType;
    if (EVar5 == EGET_ELEMENT_FOCUS_LOST) {
      if ((CGUIListBox *)(event->field_1).GUIEvent.Caller == this) {
        this->Selecting = false;
      }
    }
    else if ((EVar5 == EGET_SCROLL_BAR_CHANGED) &&
            ((event->field_1).GUIEvent.Caller == &this->ScrollBar->super_IGUIElement)) {
      return (bool)1;
    }
    goto switchD_00221de5_caseD_1;
  }
  if (EVar3 == EET_MOUSE_INPUT_EVENT) {
    local_88.str._M_dataplus._M_p = (pointer)(event->field_1).GUIEvent.Caller;
    switch((event->field_1).MouseInput.Event) {
    case EMIE_LMOUSE_PRESSED_DOWN:
      this->Selecting = true;
      return (bool)1;
    case EMIE_LMOUSE_LEFT_UP:
      this->Selecting = false;
      cVar7 = (**(code **)(*(long *)this + 0x28))(this,&local_88);
      if (cVar7 == '\0') {
        return (bool)1;
      }
      ypos = (event->field_1).MouseInput.Y;
      bVar9 = false;
LAB_00221e8c:
      selectNew(this,ypos,bVar9);
      return true;
    case EMIE_MOUSE_MOVED:
      if (((this->Selecting != false) || (this->MoveOverSelect == true)) &&
         (cVar7 = (**(code **)(*(long *)this + 0x28))(this,&local_88), cVar7 != '\0')) {
        ypos = (event->field_1).MouseInput.Y;
        bVar9 = true;
        goto LAB_00221e8c;
      }
      break;
    case EMIE_MOUSE_WHEEL:
      pIVar6 = this->ScrollBar;
      iVar11 = (*(pIVar6->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])
                         (pIVar6);
      pfVar1 = &(event->field_1).MouseInput.Wheel;
      iVar17 = -this->ItemHeight;
      if ((float)*pfVar1 <= 0.0 && (float)*pfVar1 != 0.0) {
        iVar17 = this->ItemHeight;
      }
      (*(pIVar6->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2d])
                (pIVar6,(ulong)(uint)(iVar17 / 2 + iVar11));
      return (bool)1;
    }
    goto switchD_00221de5_caseD_1;
  }
  if (EVar3 != EET_KEY_INPUT_EVENT) goto switchD_00221de5_caseD_1;
  bVar2 = (event->field_1).field13[0xc];
  if ((bVar2 & 1) == 0) {
LAB_00221ede:
    iVar17 = (event->field_1).MouseInput.Y;
    if ((iVar17 == 0x20) || (iVar17 == 0xd)) {
      plVar14 = *(long **)&this->field_0x20;
      if (plVar14 == (long *)0x0) {
        return (bool)1;
      }
      local_88.str.field_2._M_local_buf[2] = L'\n';
      goto LAB_00221f1a;
    }
LAB_00221f25:
    if ((event->field_1).MouseInput.Y == 9) {
      return (bool)0;
    }
    if (((bVar2 & 1) != 0) && ((event->field_1).MouseInput.X != 0)) {
      uVar10 = os::Timer::getTime();
      this_00 = &this->KeyBuffer;
      if (uVar10 - this->LastKeyTime < 500) {
        if (((int)(this->KeyBuffer).str._M_string_length != 1) ||
           (*(this_00->str)._M_dataplus._M_p != (event->field_1).MouseInput.X)) {
          ::std::__cxx11::wstring::append((wchar_t *)this_00,0x23941c);
          (this->KeyBuffer).str._M_dataplus._M_p[(int)(this->KeyBuffer).str._M_string_length - 1] =
               (event->field_1).MouseInput.X;
        }
      }
      else {
        core::string<wchar_t>::operator=(this_00,L" ");
        *(this_00->str)._M_dataplus._M_p = (event->field_1).MouseInput.X;
      }
      this->LastKeyTime = uVar10;
      iVar17 = this->Selected;
      lVar16 = (long)iVar17;
      if ((-1 < lVar16) && (uVar15 = (uint)(this->KeyBuffer).str._M_string_length, 1 < uVar15)) {
        pLVar12 = (this->Items).m_data.
                  super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((uint)pLVar12[lVar16].Text.str._M_string_length < uVar15) {
          bVar9 = false;
        }
        else {
          core::string<wchar_t>::subString(&local_50,&pLVar12[lVar16].Text,0,uVar15,false);
          bVar9 = core::string<wchar_t>::equals_ignore_case(this_00,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
            operator_delete(local_50.str._M_dataplus._M_p,
                            local_50.str.field_2._M_allocated_capacity * 4 + 4);
          }
        }
        if (bVar9 != false) {
          return (bool)1;
        }
      }
      uVar15 = iVar17 + 1;
      pLVar12 = (this->Items).m_data.
                super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar11 = (int)((ulong)((long)(this->Items).m_data.
                                   super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar12) >> 3)
      ;
      if (SBORROW4(uVar15,iVar11 * 0x38e38e39) != (int)(uVar15 + iVar11 * -0x38e38e39) < 0) {
        uVar13 = uVar15;
        do {
          length = (uint)(this->KeyBuffer).str._M_string_length;
          if (length <= (uint)pLVar12[uVar13].Text.str._M_string_length) {
            core::string<wchar_t>::subString(&local_88,&pLVar12[uVar13].Text,0,length,false);
            bVar9 = core::string<wchar_t>::equals_ignore_case(this_00,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
              operator_delete(local_88.str._M_dataplus._M_p,
                              local_88.str.field_2._M_allocated_capacity * 4 + 4);
            }
            if (bVar9) {
              if ((((*(long **)&this->field_0x20 != (long *)0x0) && (this->Selected != uVar13)) &&
                  (this->Selecting == false)) && (this->MoveOverSelect == false)) {
                local_88.str._M_dataplus._M_p = local_88.str._M_dataplus._M_p & 0xffffffff00000000;
                local_88.str.field_2._M_allocated_capacity = 0;
                local_88.str.field_2._M_local_buf[2] = L'\t';
                local_88.str._M_string_length = (size_type)this;
                (**(code **)(**(long **)&this->field_0x20 + 0x10))();
              }
              (**(code **)(*(long *)this + 0x170))(this,uVar13);
              return (bool)1;
            }
          }
          uVar13 = uVar13 + 1;
          pLVar12 = (this->Items).m_data.
                    super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar11 = (int)((ulong)((long)(this->Items).m_data.
                                       super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar12)
                        >> 3);
        } while (SBORROW4(uVar13,iVar11 * 0x38e38e39) != (int)(uVar13 + iVar11 * -0x38e38e39) < 0);
      }
      if (iVar17 < 0) {
        return (bool)1;
      }
      lVar16 = 0;
      iVar17 = 0;
      do {
        pLVar12 = (this->Items).m_data.
                  super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = (uint)(this->KeyBuffer).str._M_string_length;
        if (uVar13 <= *(uint *)((long)(pLVar12->OverrideColors + -4) + lVar16 + 4)) {
          core::string<wchar_t>::subString
                    (&local_88,(string<wchar_t> *)((long)pLVar12->OverrideColors + lVar16 + -0x24),0
                     ,uVar13,false);
          bVar9 = core::string<wchar_t>::equals_ignore_case(this_00,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
            operator_delete(local_88.str._M_dataplus._M_p,
                            local_88.str.field_2._M_allocated_capacity * 4 + 4);
          }
          if (bVar9) {
            if (((*(long **)&this->field_0x20 != (long *)0x0) && (this->Selected != iVar17)) &&
               ((this->Selecting == false && (this->MoveOverSelect == false)))) {
              this->Selected = iVar17;
              local_88.str._M_dataplus._M_p = local_88.str._M_dataplus._M_p & 0xffffffff00000000;
              local_88.str.field_2._M_allocated_capacity = 0;
              local_88.str.field_2._M_local_buf[2] = L'\t';
              local_88.str._M_string_length = (size_type)this;
              (**(code **)(**(long **)&this->field_0x20 + 0x10))();
            }
            (**(code **)(*(long *)this + 0x170))(this,iVar17);
            return (bool)1;
          }
        }
        iVar17 = iVar17 + 1;
        lVar16 = lVar16 + 0x48;
        if ((ulong)uVar15 * 0x48 == lVar16) {
          return (bool)1;
        }
      } while( true );
    }
switchD_00221de5_caseD_1:
    plVar14 = *(long **)&this->field_0x20;
    if (plVar14 != (long *)0x0) {
      uVar8 = (**(code **)(*plVar14 + 0x10))(plVar14,event);
      return (bool)uVar8;
    }
    return (bool)0;
  }
  EVar4 = (event->field_1).KeyInput.Key;
  if ((0x28 < (ulong)EVar4) || ((0x15e00000000U >> ((ulong)EVar4 & 0x3f) & 1) == 0)) {
    if ((bVar2 & 1) == 0) goto LAB_00221ede;
    goto LAB_00221f25;
  }
  iVar17 = this->Selected;
  switch(EVar4) {
  case KEY_PRIOR:
    iVar11 = iVar17 - (*(int *)&this->field_0x4c - *(int *)&this->field_0x44) / this->ItemHeight;
    break;
  case KEY_NEXT:
    iVar11 = (*(int *)&this->field_0x4c - *(int *)&this->field_0x44) / this->ItemHeight + iVar17;
    break;
  case KEY_END:
    iVar11 = (int)((ulong)((long)(this->Items).m_data.
                                 super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->Items).m_data.
                                super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39 + -1;
    break;
  case KEY_HOME:
    iVar11 = 0;
    break;
  default:
    goto switchD_00221da5_caseD_25;
  case KEY_UP:
    iVar11 = iVar17 + -1;
    break;
  case KEY_DOWN:
    iVar11 = iVar17 + 1;
  }
  this->Selected = iVar11;
switchD_00221da5_caseD_25:
  if (this->Selected < 0) {
    this->Selected = 0;
  }
  iVar11 = (int)((ulong)((long)(this->Items).m_data.
                               super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Items).m_data.
                              super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  if (iVar11 <= this->Selected) {
    this->Selected = iVar11 + -1;
  }
  recalculateScrollPos(this);
  if (iVar17 == this->Selected) {
    return (bool)1;
  }
  plVar14 = *(long **)&this->field_0x20;
  if (plVar14 == (long *)0x0) {
    return (bool)1;
  }
  if (this->Selecting != false) {
    return (bool)1;
  }
  if (this->MoveOverSelect != false) {
    return (bool)1;
  }
  local_88.str.field_2._M_local_buf[2] = L'\t';
LAB_00221f1a:
  local_88.str._M_dataplus._M_p = local_88.str._M_dataplus._M_p & 0xffffffff00000000;
  local_88.str.field_2._M_allocated_capacity = 0;
  local_88.str._M_string_length = (size_type)this;
  (**(code **)(*plVar14 + 0x10))();
  return (bool)1;
}

Assistant:

bool CGUIListBox::OnEvent(const SEvent &event)
{
	if (isEnabled()) {
		switch (event.EventType) {
		case EET_KEY_INPUT_EVENT:
			if (event.KeyInput.PressedDown &&
					(event.KeyInput.Key == KEY_DOWN ||
							event.KeyInput.Key == KEY_UP ||
							event.KeyInput.Key == KEY_HOME ||
							event.KeyInput.Key == KEY_END ||
							event.KeyInput.Key == KEY_NEXT ||
							event.KeyInput.Key == KEY_PRIOR)) {
				s32 oldSelected = Selected;
				switch (event.KeyInput.Key) {
				case KEY_DOWN:
					Selected += 1;
					break;
				case KEY_UP:
					Selected -= 1;
					break;
				case KEY_HOME:
					Selected = 0;
					break;
				case KEY_END:
					Selected = (s32)Items.size() - 1;
					break;
				case KEY_NEXT:
					Selected += AbsoluteRect.getHeight() / ItemHeight;
					break;
				case KEY_PRIOR:
					Selected -= AbsoluteRect.getHeight() / ItemHeight;
					break;
				default:
					break;
				}
				if (Selected < 0)
					Selected = 0;
				if (Selected >= (s32)Items.size())
					Selected = Items.size() - 1; // will set Selected to -1 for empty listboxes which is correct

				recalculateScrollPos();

				// post the news

				if (oldSelected != Selected && Parent && !Selecting && !MoveOverSelect) {
					SEvent e;
					e.EventType = EET_GUI_EVENT;
					e.GUIEvent.Caller = this;
					e.GUIEvent.Element = 0;
					e.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
					Parent->OnEvent(e);
				}

				return true;
			} else if (!event.KeyInput.PressedDown && (event.KeyInput.Key == KEY_RETURN || event.KeyInput.Key == KEY_SPACE)) {
				if (Parent) {
					SEvent e;
					e.EventType = EET_GUI_EVENT;
					e.GUIEvent.Caller = this;
					e.GUIEvent.Element = 0;
					e.GUIEvent.EventType = EGET_LISTBOX_SELECTED_AGAIN;
					Parent->OnEvent(e);
				}
				return true;
			} else if (event.KeyInput.Key == KEY_TAB) {
				return false;
			} else if (event.KeyInput.PressedDown && event.KeyInput.Char) {
				// change selection based on text as it is typed.
				u32 now = os::Timer::getTime();

				if (now - LastKeyTime < 500) {
					// add to key buffer if it isn't a key repeat
					if (!(KeyBuffer.size() == 1 && KeyBuffer[0] == event.KeyInput.Char)) {
						KeyBuffer += L" ";
						KeyBuffer[KeyBuffer.size() - 1] = event.KeyInput.Char;
					}
				} else {
					KeyBuffer = L" ";
					KeyBuffer[0] = event.KeyInput.Char;
				}
				LastKeyTime = now;

				// find the selected item, starting at the current selection
				s32 start = Selected;
				// dont change selection if the key buffer matches the current item
				if (Selected > -1 && KeyBuffer.size() > 1) {
					if (Items[Selected].Text.size() >= KeyBuffer.size() &&
							KeyBuffer.equals_ignore_case(Items[Selected].Text.subString(0, KeyBuffer.size())))
						return true;
				}

				s32 current;
				for (current = start + 1; current < (s32)Items.size(); ++current) {
					if (Items[current].Text.size() >= KeyBuffer.size()) {
						if (KeyBuffer.equals_ignore_case(Items[current].Text.subString(0, KeyBuffer.size()))) {
							if (Parent && Selected != current && !Selecting && !MoveOverSelect) {
								SEvent e;
								e.EventType = EET_GUI_EVENT;
								e.GUIEvent.Caller = this;
								e.GUIEvent.Element = 0;
								e.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
								Parent->OnEvent(e);
							}
							setSelected(current);
							return true;
						}
					}
				}
				for (current = 0; current <= start; ++current) {
					if (Items[current].Text.size() >= KeyBuffer.size()) {
						if (KeyBuffer.equals_ignore_case(Items[current].Text.subString(0, KeyBuffer.size()))) {
							if (Parent && Selected != current && !Selecting && !MoveOverSelect) {
								Selected = current;
								SEvent e;
								e.EventType = EET_GUI_EVENT;
								e.GUIEvent.Caller = this;
								e.GUIEvent.Element = 0;
								e.GUIEvent.EventType = EGET_LISTBOX_CHANGED;
								Parent->OnEvent(e);
							}
							setSelected(current);
							return true;
						}
					}
				}

				return true;
			}
			break;

		case EET_GUI_EVENT:
			switch (event.GUIEvent.EventType) {
			case gui::EGET_SCROLL_BAR_CHANGED:
				if (event.GUIEvent.Caller == ScrollBar)
					return true;
				break;
			case gui::EGET_ELEMENT_FOCUS_LOST: {
				if (event.GUIEvent.Caller == this)
					Selecting = false;
			}
			default:
				break;
			}
			break;

		case EET_MOUSE_INPUT_EVENT: {
			core::position2d<s32> p(event.MouseInput.X, event.MouseInput.Y);

			switch (event.MouseInput.Event) {
			case EMIE_MOUSE_WHEEL:
				ScrollBar->setPos(ScrollBar->getPos() + (event.MouseInput.Wheel < 0 ? -1 : 1) * -ItemHeight / 2);
				return true;

			case EMIE_LMOUSE_PRESSED_DOWN: {
				Selecting = true;
				return true;
			}

			case EMIE_LMOUSE_LEFT_UP: {
				Selecting = false;

				if (isPointInside(p))
					selectNew(event.MouseInput.Y);

				return true;
			}

			case EMIE_MOUSE_MOVED:
				if (Selecting || MoveOverSelect) {
					if (isPointInside(p)) {
						selectNew(event.MouseInput.Y, true);
						return true;
					}
				}
			default:
				break;
			}
		} break;
		default:
			break;
		}
	}

	return IGUIElement::OnEvent(event);
}